

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderDrawCallWithFSAndGS::iterate(GeometryShaderDrawCallWithFSAndGS *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_510;
  MessageBuilder local_390;
  MessageBuilder local_210;
  int local_8c;
  undefined8 uStack_88;
  GLint link_status;
  char *code_gs_specialized_raw;
  string code_gs_specialized;
  char *code_fs_specialized_raw;
  string code_fs_specialized;
  bool local_21;
  bool result;
  Functions *gl;
  GeometryShaderDrawCallWithFSAndGS *pGStack_10;
  GLenum error_code;
  GeometryShaderDrawCallWithFSAndGS *this_local;
  long lVar5;
  
  gl._4_4_ = 0;
  pGStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x4f4);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x4f9);
  (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x4fc);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&code_fs_specialized_raw,&this->super_TestCaseBase,1,&dummy_fs_code);
  code_gs_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&code_gs_specialized_raw,&this->super_TestCaseBase,1,&dummy_gs_code);
  uStack_88 = std::__cxx11::string::c_str();
  local_8c = 0;
  GVar3 = (**(code **)(lVar5 + 0x3f8))
                    (0x8b30,1,(undefined1 *)((long)&code_gs_specialized.field_2 + 8));
  this->m_fs_po_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f8))(0x8dd9,1,&stack0xffffffffffffff78);
  this->m_gs_po_id = GVar3;
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glCreateShaderProgramv() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x50c);
  (**(code **)(lVar5 + 0x9d8))(this->m_fs_po_id,0x8b82,&local_8c);
  if (local_8c == 1) {
    (**(code **)(lVar5 + 0x9d8))(this->m_gs_po_id,0x8b82,&local_8c);
    if (local_8c == 1) {
      (**(code **)(lVar5 + 0x6d8))(1,&this->m_pipeline_object_id);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glGenProgramPipelines() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x526);
      (**(code **)(lVar5 + 0x1688))(this->m_pipeline_object_id,2,this->m_fs_po_id);
      (**(code **)(lVar5 + 0x1688))(this->m_pipeline_object_id,4,this->m_gs_po_id);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glUseProgramStages() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x52a);
      (**(code **)(lVar5 + 0x98))(this->m_pipeline_object_id);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glBindProgramPipeline() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x52d);
      (**(code **)(lVar5 + 0x538))(0,0,1);
      gl._4_4_ = (**(code **)(lVar5 + 0x800))();
      local_21 = gl._4_4_ != 0x502;
      if (local_21) {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_510,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_510,(char (*) [44])"Invalid draw call generated an error code [")
        ;
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)((long)&gl + 4));
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [61])
                                   "] which is different from the expected GL_INVALID_OPERATION.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_510);
      }
      local_21 = !local_21;
    }
    else {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_390,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_390,(char (*) [46])"Dummy geometry shader program failed to link.")
      ;
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_390);
      local_21 = false;
    }
  }
  else {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_210,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_210,(char (*) [46])"Dummy fragment shader program failed to link.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_210);
    local_21 = false;
  }
  if (this->m_pipeline_object_id != 0) {
    (**(code **)(lVar5 + 0x450))(1);
    this->m_pipeline_object_id = 0;
  }
  if (this->m_gs_po_id != 0) {
    (**(code **)(lVar5 + 0x448))(this->m_gs_po_id);
    this->m_gs_po_id = 0;
  }
  if (this->m_fs_po_id != 0) {
    (**(code **)(lVar5 + 0x448))(this->m_fs_po_id);
    this->m_fs_po_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar5 + 0x490))(1);
    this->m_vao_id = 0;
  }
  if (local_21) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  std::__cxx11::string::~string((string *)&code_gs_specialized_raw);
  std::__cxx11::string::~string((string *)&code_fs_specialized_raw);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderDrawCallWithFSAndGS::iterate()
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	bool				  result	 = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Create shader program objects */
	std::string code_fs_specialized = specializeShader(1, /* parts */
													   &dummy_fs_code);
	const char* code_fs_specialized_raw = code_fs_specialized.c_str();
	std::string code_gs_specialized		= specializeShader(1, /* parts */
													   &dummy_gs_code);
	const char* code_gs_specialized_raw = code_gs_specialized.c_str();
	glw::GLint  link_status				= GL_FALSE;

	m_fs_po_id = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, /* count */
										 &code_fs_specialized_raw);
	m_gs_po_id = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1, /* count */
										 &code_gs_specialized_raw);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call(s) failed.");

	gl.getProgramiv(m_fs_po_id, GL_LINK_STATUS, &link_status);

	if (link_status != GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Dummy fragment shader program failed to link."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	gl.getProgramiv(m_gs_po_id, GL_LINK_STATUS, &link_status);

	if (link_status != GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Dummy geometry shader program failed to link."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create & set up a pipeline object */
	gl.genProgramPipelines(1, &m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

	gl.useProgramStages(m_pipeline_object_id, GL_FRAGMENT_SHADER_BIT, m_fs_po_id);
	gl.useProgramStages(m_pipeline_object_id, GL_GEOMETRY_SHADER_BIT, m_gs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call(s) failed.");

	gl.bindProgramPipeline(m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

	/* Try to do a draw call */
	gl.drawArrays(GL_POINTS, 0, /* first */
				  1);			/* count */

	error_code = gl.getError();
	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid draw call generated an error code [" << error_code
						   << "]"
							  " which is different from the expected GL_INVALID_OPERATION."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

end:
	// m_pipeline_object_id is generated in this function, need to be freed
	if (m_pipeline_object_id)
	{
		gl.deleteProgramPipelines(1, &m_pipeline_object_id);
		m_pipeline_object_id = 0;
	}

	// m_gs_po_id is generated in this function, need to be freed
	if (m_gs_po_id)
	{
		gl.deleteProgram(m_gs_po_id);
		m_gs_po_id = 0;
	}

	// m_fs_po_id is generated in this function, need to be freed
	if (m_fs_po_id)
	{
		gl.deleteProgram(m_fs_po_id);
		m_fs_po_id = 0;
	}

	// m_vao_id is generated in this function, need to be freed
	if (m_vao_id)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	/* All done */
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}